

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledOutputFile::breakTile
          (DeepTiledOutputFile *this,int dx,int dy,int lx,int ly,int offset,int length,char c)

{
  long *plVar1;
  Int64 *pIVar2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int i;
  stringstream _iex_throw_s;
  Int64 position;
  Lock lock;
  Lock *in_stack_fffffffffffffdc0;
  Mutex *in_stack_fffffffffffffdc8;
  Lock *in_stack_fffffffffffffdd0;
  TileOffsets *in_stack_fffffffffffffdd8;
  int local_1d4;
  stringstream local_1d0 [16];
  ostream local_1c0 [392];
  Int64 local_38;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0));
  pIVar2 = TileOffsets::operator()
                     (in_stack_fffffffffffffdd8,(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                      (int)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20)
                      ,(int)in_stack_fffffffffffffdc8);
  local_38 = *pIVar2;
  if (local_38 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1d0);
    poVar3 = std::operator<<(local_1c0,"Cannot overwrite tile (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,"). The tile has not yet been stored in file \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x2f8aae);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_1d0);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1c0) + 0x30) = 0;
  plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1c0) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_38 + (long)local_1c);
  for (local_1d4 = 0; local_1d4 < in_stack_00000008; local_1d4 = local_1d4 + 1) {
    plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1c0) + 0x28);
    (**(code **)(*plVar1 + 0x10))(plVar1,&stack0x00000010,1);
  }
  IlmThread_2_5::Lock::~Lock(in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void
DeepTiledOutputFile::breakTile
    (int dx, int dy,
     int lx, int ly,
     int offset,
     int length,
     char c)
{
    Lock lock (*_data->_streamData);

    Int64 position = _data->tileOffsets (dx, dy, lx, ly);

    if (!position)
        THROW (IEX_NAMESPACE::ArgExc,
               "Cannot overwrite tile "
               "(" << dx << ", " << dy << ", " << lx << "," << ly << "). "
               "The tile has not yet been stored in "
               "file \"" << fileName() << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}